

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  _Alloc_hider _Var1;
  char *in_RDX;
  char *pcVar2;
  allocator local_41;
  _Alloc_hider local_40;
  string local_38 [32];
  
  pcVar2 = "";
  if (in_RDX != (char *)0x0) {
    pcVar2 = in_RDX;
  }
  std::__cxx11::string::string(local_38,pcVar2,&local_41);
  Parse((cmGeneratorExpression *)&local_40,(string *)input);
  _Var1._M_p = local_40._M_p;
  local_40._M_p = (pointer)0x0;
  (this->Backtrace).Context.Name._M_dataplus._M_p = _Var1._M_p;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_40);
  std::__cxx11::string::~string(local_38);
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

cmsys::auto_ptr<cmCompiledGeneratorExpression>
cmGeneratorExpression::Parse(const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}